

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O3

int __thiscall
soul::RenderingVenue::Pimpl::SessionImpl::link(SessionImpl *this,char *__from,char *__to)

{
  _Manager_type p_Var1;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar2;
  _Any_data local_140;
  _Manager_type local_130;
  undefined1 local_120 [48];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> local_d0;
  Value local_b8;
  _Any_data local_50;
  _Manager_type local_40;
  _Invoker_type local_38;
  
  local_120._8_4_ = *(undefined4 *)__from;
  local_120._12_4_ = *(undefined4 *)(__from + 4);
  local_120._16_4_ = *(undefined4 *)(__from + 8);
  local_120[0x14] = __from[0xc];
  local_120[0x15] = __from[0xd];
  local_120[0x16] = __from[0xe];
  local_120[0x17] = __from[0xf];
  local_120._24_4_ = *(undefined4 *)(__from + 0x10);
  local_120._28_4_ = *(undefined4 *)(__from + 0x14);
  local_120._32_4_ = *(undefined4 *)(__from + 0x18);
  local_120._36_4_ = *(undefined4 *)(__from + 0x1c);
  local_120._40_8_ = *(undefined8 *)(__from + 0x20);
  local_120._0_8_ = this;
  local_f0._M_p = (pointer)&local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,*(long *)(__from + 0x28),
             *(long *)(__from + 0x30) + *(long *)(__from + 0x28));
  std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::vector
            (&local_d0,
             (vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> *)(__from + 0x48));
  choc::value::Value::Value(&local_b8,(Value *)(__from + 0x60));
  local_50._M_unused._M_object = (void *)0x0;
  local_50._8_8_ = 0;
  local_40 = (_Manager_type)0x0;
  local_38 = *(_Invoker_type *)(__to + 0x18);
  p_Var1 = *(_Manager_type *)(__to + 0x10);
  if (p_Var1 != (_Manager_type)0x0) {
    local_50._M_unused._0_8_ = (undefined8)*(undefined8 *)__to;
    local_50._8_8_ = *(undefined8 *)(__to + 8);
    __to[0x10] = '\0';
    __to[0x11] = '\0';
    __to[0x12] = '\0';
    __to[0x13] = '\0';
    __to[0x14] = '\0';
    __to[0x15] = '\0';
    __to[0x16] = '\0';
    __to[0x17] = '\0';
    __to[0x18] = '\0';
    __to[0x19] = '\0';
    __to[0x1a] = '\0';
    __to[0x1b] = '\0';
    __to[0x1c] = '\0';
    __to[0x1d] = '\0';
    __to[0x1e] = '\0';
    __to[0x1f] = '\0';
    local_40 = p_Var1;
  }
  std::function<void(std::atomic<int>&)>::
  function<soul::RenderingVenue::Pimpl::SessionImpl::link(soul::BuildSettings_const&,std::function<void(soul::CompileMessageList_const&)>)::_lambda(std::atomic<int>&)_1_,void>
            ((function<void(std::atomic<int>&)> *)local_140._M_pod_data,
             (anon_class_240_3_a0b0fe3a *)local_120);
  TaskThread::Queue::addTask(&this->taskQueue,(TaskFunction *)&local_140);
  if (local_130 != (code *)0x0) {
    (*local_130)(&local_140,&local_140,__destroy_functor);
  }
  if (local_40 != (_Manager_type)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  choc::value::Value::~Value(&local_b8);
  std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::~vector(&local_d0);
  uVar2 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
    uVar2 = extraout_RAX_00;
  }
  return (int)CONCAT71((int7)((ulong)uVar2 >> 8),1);
}

Assistant:

bool link (const BuildSettings& settings, CompileTaskFinishedCallback linkFinishedCallback) override
        {
            taskQueue.addTask ([this, settings, callback = std::move (linkFinishedCallback)] (TaskThread::ShouldStopFlag& cancelled)
            {
                if (state == SessionState::loaded)
                {
                    CompileMessageList messageList;
                    bool ok = performer->link (messageList, settings, {});

                    if (cancelled)
                        return;

                    maxBlockSize = performer->getBlockSize();
                    SOUL_ASSERT (maxBlockSize != 0);
                    callback (messageList);

                    if (ok)
                        setState (SessionState::linked);
                }
            });

            return true;
        }